

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
CorruptInternalNodes_BitmapIsZero_Test::TestBody(CorruptInternalNodes_BitmapIsZero_Test *this)

{
  index_pointer node;
  shared_ptr<pstore::index::details::internal_node> inode;
  transaction_type t1;
  undefined1 local_60 [16];
  transaction<std::unique_lock<mock_mutex>_> local_50;
  
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)local_60,
             (mutex_type *)
             &(this->super_CorruptInternalNodes).super_GenericIndexFixture.super_IndexFixture.
              field_0x10);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)(local_60 + 0x10),
             &(this->super_CorruptInternalNodes).super_GenericIndexFixture.super_IndexFixture.db_,
             (unique_lock<mock_mutex> *)local_60);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)local_60);
  node.internal_ = (internal_node *)(local_60 + 0x10);
  anon_unknown.dwarf_13be9a::CorruptInternalNodes::build
            (&this->super_CorruptInternalNodes,(transaction_type *)node.internal_);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::check_is_store_internal_node
            ((GenericIndexFixture *)
             (((this->super_CorruptInternalNodes).index_._M_t.
               super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
              ._M_head_impl)->root_).internal_,node);
  anon_unknown.dwarf_13be9a::CorruptInternalNodes::load_inode
            ((CorruptInternalNodes *)local_60,(index_pointer)this);
  *(undefined8 *)(local_60._0_8_ + 8) = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  pstore::transaction_base::commit((transaction_base *)(local_60 + 0x10));
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)(local_60 + 0x10));
  anon_unknown.dwarf_13be9a::CorruptInternalNodes::iterate(&this->super_CorruptInternalNodes);
  anon_unknown.dwarf_13be9a::CorruptInternalNodes::find(&this->super_CorruptInternalNodes);
  return;
}

Assistant:

TEST_F (CorruptInternalNodes, BitmapIsZero) {
    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        this->build (t1);

        index_pointer root = index_->root ();
        this->check_is_store_internal_node (root);

        // Corrupt the bitmap field.
        {
            auto inode = this->load_inode (root);
            inode->set_bitmap (0);
        }

        t1.commit ();
    }
    this->iterate ();
    this->find ();
}